

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.hpp
# Opt level: O0

unsigned_long __thiscall
duckdb::BitReader::ReadBytes<unsigned_long,(unsigned_char)8>(BitReader *this,uint8_t *remainder)

{
  byte bVar1;
  unsigned_long uVar2;
  uint8_t *puVar3;
  BitReader *this_00;
  byte *in_RSI;
  BitReader *in_RDI;
  unsigned_long result;
  uint8_t *in_stack_ffffffffffffffb8;
  BitReader *in_stack_ffffffffffffffc0;
  
  bVar1 = InnerReadByte(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  uVar2 = UnsafeNumericCast<unsigned_long,unsigned_long,void>((ulong)bVar1);
  bVar1 = InnerReadByte(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  uVar2 = UnsafeNumericCast<unsigned_long,unsigned_long,void>(uVar2 << 8 | (ulong)bVar1);
  bVar1 = InnerReadByte(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  uVar2 = UnsafeNumericCast<unsigned_long,unsigned_long,void>(uVar2 << 8 | (ulong)bVar1);
  bVar1 = InnerReadByte(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  uVar2 = UnsafeNumericCast<unsigned_long,unsigned_long,void>(uVar2 << 8 | (ulong)bVar1);
  bVar1 = InnerReadByte(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  uVar2 = UnsafeNumericCast<unsigned_long,unsigned_long,void>(uVar2 << 8 | (ulong)bVar1);
  bVar1 = InnerReadByte(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  uVar2 = UnsafeNumericCast<unsigned_long,unsigned_long,void>(uVar2 << 8 | (ulong)bVar1);
  puVar3 = (uint8_t *)(uVar2 << 8);
  bVar1 = InnerReadByte(in_stack_ffffffffffffffc0,puVar3);
  uVar2 = UnsafeNumericCast<unsigned_long,unsigned_long,void>((ulong)puVar3 | (ulong)bVar1);
  this_00 = (BitReader *)(uVar2 << 8);
  bVar1 = InnerReadByte(this_00,puVar3);
  uVar2 = UnsafeNumericCast<unsigned_long,unsigned_long,void>((ulong)this_00 | (ulong)bVar1);
  puVar3 = (uint8_t *)(uVar2 << (*in_RSI & 0x3f));
  bVar1 = InnerRead(in_RDI,puVar3,(uint8_t *)this_00);
  uVar2 = UnsafeNumericCast<unsigned_long,unsigned_long,void>((ulong)puVar3 | (ulong)bVar1);
  in_RDI->index = *in_RSI + 0x40 + in_RDI->index;
  return uVar2;
}

Assistant:

inline T ReadBytes(const uint8_t &remainder) {
		T result = 0;
		if (BYTES > 0) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(0));
		}
		if (BYTES > 1) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(1));
		}
		if (BYTES > 2) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(2));
		}
		if (BYTES > 3) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(3));
		}
		if (BYTES > 4) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(4));
		}
		if (BYTES > 5) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(5));
		}
		if (BYTES > 6) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(6));
		}
		if (BYTES > 7) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(7));
		}
		result = UnsafeNumericCast<T>(result << remainder | InnerRead(remainder, BYTES));
		index += (BYTES << 3) + remainder;
		return result;
	}